

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O0

bool __thiscall
draco::RAnsSymbolEncoder<5>::EncodeTable(RAnsSymbolEncoder<5> *this,EncoderBuffer *buffer)

{
  reference pvVar1;
  EncoderBuffer *in_RSI;
  vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *in_RDI;
  int b;
  uint32_t next_prob;
  uint32_t offset;
  int num_extra_bytes;
  uint32_t prob;
  uint32_t i;
  EncoderBuffer *in_stack_ffffffffffffffb8;
  int local_34;
  uint local_28;
  int local_24;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  
  EncodeVarint<unsigned_int>((uint)in_RDI,in_stack_ffffffffffffffb8);
  uVar4 = 0;
  while( true ) {
    if (*(uint *)&in_RDI[1].super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                  _M_impl.super__Vector_impl_data._M_start <= uVar4) {
      return true;
    }
    pvVar1 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                       (in_RDI,(ulong)uVar4);
    uVar3 = pvVar1->prob;
    local_24 = 0;
    if (((0x3f < uVar3) && (local_24 = 1, 0x3fff < uVar3)) && (local_24 = 2, 0x3fffff < uVar3))
    break;
    if (uVar3 == 0) {
      local_28 = 0;
      uVar2 = 0;
      while ((local_28 < 0x3f &&
             (pvVar1 = std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::operator[]
                                 (in_RDI,(ulong)(uVar4 + local_28 + 1)), pvVar1->prob == 0))) {
        local_28 = local_28 + 1;
      }
      EncoderBuffer::Encode<unsigned_char>(in_RSI,(uchar *)CONCAT44(uVar4,uVar2));
      uVar4 = local_28 + uVar4;
    }
    else {
      EncoderBuffer::Encode<unsigned_char>(in_RSI,(uchar *)CONCAT44(uVar4,uVar3));
      for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
        EncoderBuffer::Encode<unsigned_char>(in_RSI,(uchar *)CONCAT44(uVar4,uVar3));
      }
    }
    uVar4 = uVar4 + 1;
  }
  return false;
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::EncodeTable(
    EncoderBuffer *buffer) {
  EncodeVarint(num_symbols_, buffer);
  // Use varint encoding for the probabilities (first two bits represent the
  // number of bytes used - 1).
  for (uint32_t i = 0; i < num_symbols_; ++i) {
    const uint32_t prob = probability_table_[i].prob;
    int num_extra_bytes = 0;
    if (prob >= (1 << 6)) {
      num_extra_bytes++;
      if (prob >= (1 << 14)) {
        num_extra_bytes++;
        if (prob >= (1 << 22)) {
          // The maximum number of precision bits is 20 so we should not really
          // get to this point.
          return false;
        }
      }
    }
    if (prob == 0) {
      // When the probability of the symbol is 0, set the first two bits to 1
      // (unique identifier) and use the remaining 6 bits to store the offset
      // to the next symbol with non-zero probability.
      uint32_t offset = 0;
      for (; offset < (1 << 6) - 1; ++offset) {
        // Note: we don't have to check whether the next symbol id is larger
        // than num_symbols_ because we know that the last symbol always has
        // non-zero probability.
        const uint32_t next_prob = probability_table_[i + offset + 1].prob;
        if (next_prob > 0) {
          break;
        }
      }
      buffer->Encode(static_cast<uint8_t>((offset << 2) | 3));
      i += offset;
    } else {
      // Encode the first byte (including the number of extra bytes).
      buffer->Encode(static_cast<uint8_t>((prob << 2) | (num_extra_bytes & 3)));
      // Encode the extra bytes.
      for (int b = 0; b < num_extra_bytes; ++b) {
        buffer->Encode(static_cast<uint8_t>(prob >> (8 * (b + 1) - 2)));
      }
    }
  }
  return true;
}